

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::SparseBufferTestUtilities::getSparseBOFlagsString_abi_cxx11_
          (string *__return_storage_ptr__,SparseBufferTestUtilities *this,GLenum flags)

{
  uint uVar1;
  bool *pbVar2;
  char cVar3;
  stringstream result_sstream;
  stringstream asStack_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  uVar1 = (uint)this;
  cVar3 = (uVar1 >> 9 & 1) != 0;
  if ((bool)cVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GL_CLIENT_STORAGE_BIT",0x15);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    pbVar2 = (bool *)0x1cd1c91;
    if (((ulong)this & 0x200) == 0) {
      pbVar2 = ::glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,pbVar2,(ulong)((uVar1 & 0x200) >> 9) * 3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GL_DYNAMIC_STORAGE_BIT",0x16);
    cVar3 = cVar3 + '\x01';
  }
  if ((char)this < '\0') {
    pbVar2 = (bool *)0x1cd1c91;
    if (cVar3 == '\0') {
      pbVar2 = ::glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,pbVar2,(ulong)(cVar3 != '\0') * 3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GL_MAP_COHERENT_BIT",0x13);
    cVar3 = cVar3 + '\x01';
  }
  if (((ulong)this & 0x40) != 0) {
    pbVar2 = (bool *)0x1cd1c91;
    if (cVar3 == '\0') {
      pbVar2 = ::glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,pbVar2,(ulong)(cVar3 != '\0') * 3);
    cVar3 = '\x01';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GL_MAP_PERSISTENT_BIT",0x15);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    pbVar2 = (bool *)0x1cd1c91;
    if (cVar3 == '\0') {
      pbVar2 = ::glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,pbVar2,(ulong)(cVar3 != '\0') * 3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GL_SPARSE_STORAGE_BIT",0x15);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string SparseBufferTestUtilities::getSparseBOFlagsString(glw::GLenum flags)
{
	unsigned int	  n_flags_added = 0;
	std::stringstream result_sstream;

	if ((flags & GL_CLIENT_STORAGE_BIT) != 0)
	{
		result_sstream << "GL_CLIENT_STORAGE_BIT";

		++n_flags_added;
	}

	if ((flags & GL_DYNAMIC_STORAGE_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_DYNAMIC_STORAGE_BIT";

		++n_flags_added;
	}

	if ((flags & GL_MAP_COHERENT_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_MAP_COHERENT_BIT";

		++n_flags_added;
	}

	if ((flags & GL_MAP_PERSISTENT_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_MAP_PERSISTENT_BIT";

		++n_flags_added;
	}

	if ((flags & GL_SPARSE_STORAGE_BIT_ARB) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_SPARSE_STORAGE_BIT";

		++n_flags_added;
	}

	return result_sstream.str();
}